

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O1

int CVmRun::get_stm_bounds
              (CVmFuncPtr *func_ptr,ulong method_ofs,CVmDbgLinePtr *caller_line_ptr,
              uchar **stm_start,uchar **stm_end)

{
  ushort uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  CVmDbgLinePtr next_line_ptr;
  ushort *puVar6;
  bool bVar7;
  CVmDbgTablePtr dbg_ptr;
  CVmDbgTablePtr local_38;
  
  iVar5 = 0;
  *stm_end = (uchar *)0x0;
  *stm_start = (uchar *)0x0;
  iVar3 = CVmFuncPtr::set_dbg_ptr(func_ptr,&local_38);
  if ((iVar3 != 0) && (*(ushort *)(local_38.p_ + G_dbg_hdr_size_X) != 0)) {
    iVar3 = *(ushort *)(local_38.p_ + G_dbg_hdr_size_X) - 1;
    iVar5 = 0;
    do {
      if (iVar3 < iVar5) {
        return 0;
      }
      iVar4 = (iVar3 - iVar5) / 2 + iVar5;
      lVar2 = G_line_entry_size_X * (long)iVar4 + G_dbg_hdr_size_X;
      if (iVar4 == *(ushort *)(local_38.p_ + G_dbg_hdr_size_X) - 1) {
        puVar6 = (ushort *)(func_ptr->p_ + 8);
      }
      else {
        puVar6 = (ushort *)(local_38.p_ + lVar2 + 2 + G_line_entry_size_X);
      }
      uVar1 = *puVar6;
      if (method_ofs < uVar1) {
        if (method_ofs <
            *(ushort *)(local_38.p_ + G_line_entry_size_X * (long)iVar4 + 2 + G_dbg_hdr_size_X)) {
          bVar7 = iVar4 != iVar3;
          iVar3 = iVar3 + -1;
          if (bVar7) {
            iVar3 = iVar4;
          }
          bVar7 = true;
        }
        else {
          *stm_start = func_ptr->p_ +
                       *(ushort *)
                        (local_38.p_ + G_line_entry_size_X * (long)iVar4 + 2 + G_dbg_hdr_size_X);
          *stm_end = func_ptr->p_ + uVar1;
          if (caller_line_ptr != (CVmDbgLinePtr *)0x0) {
            caller_line_ptr->p_ = local_38.p_ + lVar2 + 2;
          }
          bVar7 = false;
        }
      }
      else {
        iVar5 = iVar4 + (uint)((iVar3 - iVar5) + 1U < 3);
        bVar7 = true;
      }
    } while (bVar7);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int CVmRun::get_stm_bounds(VMG_ const CVmFuncPtr *func_ptr,
                           ulong method_ofs,
                           CVmDbgLinePtr *caller_line_ptr,
                           const uchar **stm_start, const uchar **stm_end)
{
    CVmDbgTablePtr dbg_ptr;
    int lo;
    int hi;
    int cur;

    /* presume we won't find anything */
    *stm_start = *stm_end = 0;

    /* 
     *   if the current method has no line records, we can't find the
     *   boundaries 
     */
    if (!func_ptr->set_dbg_ptr(&dbg_ptr)
        || dbg_ptr.get_line_count(vmg0_) == 0)
    {
        /* indicate that we didn't find debug information */
        return FALSE;
    }

    /*
     *   We must perform a binary search of the line records for the line
     *   that contains this program counter offset.  
     */
    lo = 0;
    hi = dbg_ptr.get_line_count(vmg0_) - 1;
    while (lo <= hi)
    {
        ulong start_ofs;
        ulong end_ofs;
        CVmDbgLinePtr line_ptr;

        /* split the difference and get the current entry */
        cur = lo + (hi - lo)/2;
        dbg_ptr.set_line_ptr(vmg_ &line_ptr, cur);

        /* get the current statement's start relative to the method header */
        start_ofs = line_ptr.get_start_ofs();

        /* 
         *   Get the next statement's start offset, which gives us the end
         *   of this statement.  If this is the last statement in the table,
         *   it runs to the end of the function; use the debug records table
         *   offset as the upper bound in this case.  
         */
        if (cur == (int)dbg_ptr.get_line_count(vmg0_) - 1)
        {
            /* 
             *   it's the last record - use the debug table offset as an
             *   upper bound, since we know the function can't have any
             *   executable code past this point 
             */
            end_ofs = func_ptr->get_debug_ofs();
        }
        else
        {
            CVmDbgLinePtr next_line_ptr;

            /* another record follows this one - use it */
            next_line_ptr.copy_from(&line_ptr);
            next_line_ptr.inc(vmg0_);
            end_ofs = next_line_ptr.get_start_ofs();
        }

        /* see where we are relative to this line record */
        if (method_ofs >= end_ofs)
        {
            /* we need to go higher */
            lo = (cur == lo ? cur + 1 : cur);
        }
        else if (method_ofs < start_ofs)
        {
            /* we need to go lower */
            hi = (cur == hi ? hi - 1 : cur);
        }
        else
        {
            /* found it - set the bounds to this record's limits */
            *stm_start = func_ptr->get() + start_ofs;
            *stm_end = func_ptr->get() + end_ofs;

            /* fill in the caller's line pointer if desired */
            if (caller_line_ptr != 0)
                caller_line_ptr->copy_from(&line_ptr);

            /* indicate that we found the line boundaries successfully */
            return TRUE;
        }
    }

    /* return failure */
    return FALSE;
}